

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

bool dxil_spv::emit_atomic_cmpxchg_instruction(Impl *impl,CallInst *instruction)

{
  StorageClass storage;
  Builder *pBVar1;
  CallInst *pCVar2;
  bool bVar3;
  Id IVar4;
  Id IVar5;
  Id IVar6;
  Value *pVVar7;
  Type *pTVar8;
  Operation *this;
  Id new_value_id;
  Id comparison_id;
  Operation *op;
  Id counter_ptr_id;
  Id IStack_5c;
  ComponentType component_type;
  RawWidth width;
  Id coord;
  uint32_t i;
  BufferAccessInfo access;
  uint32_t num_coords;
  uint32_t num_coords_full;
  Id coords [3];
  mapped_type *meta;
  Builder *pBStack_28;
  Id image_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  pBStack_28 = Converter::Impl::builder(impl);
  pCVar2 = instruction_local;
  pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
  meta._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar7,0);
  if (meta._4_4_ == *(Id *)&instruction_local[6].super_Instruction.super_Value.field_0xc) {
    bVar3 = emit_magic_ags_instruction((Impl *)instruction_local,(CallInst *)builder);
    return bVar3;
  }
  coords._4_8_ = std::
                 unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                 ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                               *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                  _M_rehash_policy._M_next_resize,(key_type *)((long)&meta + 4));
  emit_buffer_synchronization_validation((Impl *)instruction_local,(CallInst *)builder,AtomicRMW);
  memset(&num_coords,0,0xc);
  pCVar2 = instruction_local;
  pBVar1 = builder;
  access.raw_vec_size = V1;
  access.index_id = 0;
  if (((*(char *)coords._4_8_ == '\f') || (*(char *)coords._4_8_ == '\v')) ||
     (*(char *)coords._4_8_ == '\n')) {
    IVar4 = *(Id *)(coords._4_8_ + 0x40);
    pTVar8 = LLVMBC::Value::getType((Value *)builder);
    _coord = build_buffer_access((Impl *)pCVar2,(CallInst *)pBVar1,0,IVar4,pTVar8,1);
    num_coords = coord;
    access.index_id = 1;
    access.raw_vec_size = V2;
  }
  else {
    bVar3 = get_image_dimensions
                      ((Impl *)instruction_local,meta._4_4_,&access.raw_vec_size,&access.index_id);
    if (!bVar3) {
      return false;
    }
    if (V4 < access.raw_vec_size) {
      return false;
    }
    for (width = B8; pCVar2 = instruction_local, width < access.raw_vec_size; width = width + B16) {
      pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)builder,width + B32);
      IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar7,0);
      (&num_coords)[width] = IVar4;
    }
  }
  pCVar2 = instruction_local;
  IVar4 = spv::Builder::makeUintType(pBStack_28,0x20);
  IStack_5c = Converter::Impl::build_vector((Impl *)pCVar2,IVar4,&num_coords,access.raw_vec_size);
  pCVar2 = instruction_local;
  storage = *(StorageClass *)(coords._4_8_ + 0x2c);
  pTVar8 = LLVMBC::Value::getType((Value *)builder);
  counter_ptr_id = get_buffer_access_bits_per_component((Impl *)pCVar2,storage,pTVar8);
  if (counter_ptr_id == B64) {
    spv::Builder::addCapability(pBStack_28,CapabilityInt64Atomics);
  }
  op._0_4_ = emit_atomic_access_chain
                       ((Impl *)instruction_local,(ResourceMeta *)coords._4_8_,counter_ptr_id,
                        meta._4_4_,IStack_5c,(ComponentType *)((long)&op + 7));
  if ((*(byte *)(coords._4_8_ + 0x29) & 1) != 0) {
    spv::Builder::addDecoration(pBStack_28,(Id)op,DecorationNonUniform,-1);
  }
  pCVar2 = instruction_local;
  pBVar1 = builder;
  IVar4 = Converter::Impl::get_type_id((Impl *)instruction_local,op._7_1_,1,1,false);
  this = Converter::Impl::allocate((Impl *)pCVar2,OpAtomicCompareExchange,(Value *)pBVar1,IVar4);
  pCVar2 = instruction_local;
  pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)builder,5);
  IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar7,0);
  pCVar2 = instruction_local;
  pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)builder,6);
  IVar5 = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar7,0);
  IVar4 = Converter::Impl::fixup_store_type_atomic((Impl *)instruction_local,op._7_1_,1,IVar4);
  IVar5 = Converter::Impl::fixup_store_type_atomic((Impl *)instruction_local,op._7_1_,1,IVar5);
  Operation::add_id(this,(Id)op);
  IVar6 = spv::Builder::makeUintConstant(pBStack_28,1,false);
  Operation::add_id(this,IVar6);
  IVar6 = spv::Builder::makeUintConstant(pBStack_28,0,false);
  Operation::add_id(this,IVar6);
  IVar6 = spv::Builder::makeUintConstant(pBStack_28,0,false);
  Operation::add_id(this,IVar6);
  Operation::add_id(this,IVar5);
  Operation::add_id(this,IVar4);
  Converter::Impl::add((Impl *)instruction_local,this,(bool)(*(byte *)(coords._4_8_ + 0x2b) & 1));
  Converter::Impl::fixup_load_type_atomic((Impl *)instruction_local,op._7_1_,1,(Value *)builder);
  return true;
}

Assistant:

bool emit_atomic_cmpxchg_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));

	if (image_id == impl.ags.magic_ptr_id)
		return emit_magic_ags_instruction(impl, instruction);

	const auto &meta = impl.handle_to_resource_meta[image_id];

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::AtomicRMW);

	spv::Id coords[3] = {};
	uint32_t num_coords_full = 0, num_coords = 0;

	if (meta.kind == DXIL::ResourceKind::StructuredBuffer ||
	    meta.kind == DXIL::ResourceKind::RawBuffer ||
	    meta.kind == DXIL::ResourceKind::TypedBuffer)
	{
		auto access = build_buffer_access(impl, instruction, 0, meta.index_offset_id, instruction->getType(), 1);
		coords[0] = access.index_id;
		num_coords = 1;
		num_coords_full = 1;
	}
	else
	{
		if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
			return false;

		if (num_coords_full > 3)
			return false;

		for (uint32_t i = 0; i < num_coords_full; i++)
			coords[i] = impl.get_id_for_value(instruction->getOperand(2 + i));
	}

	spv::Id coord = impl.build_vector(builder.makeUintType(32), coords, num_coords_full);

	auto width = get_buffer_access_bits_per_component(impl, meta.storage, instruction->getType());
	if (width == RawWidth::B64)
		builder.addCapability(spv::CapabilityInt64Atomics);

	DXIL::ComponentType component_type;
	spv::Id counter_ptr_id = emit_atomic_access_chain(impl, meta, width, image_id, coord, component_type);

	if (meta.non_uniform)
		builder.addDecoration(counter_ptr_id, spv::DecorationNonUniformEXT);

	Operation *op =
	    impl.allocate(spv::OpAtomicCompareExchange, instruction, impl.get_type_id(component_type, 1, 1));

	spv::Id comparison_id = impl.get_id_for_value(instruction->getOperand(5));
	spv::Id new_value_id = impl.get_id_for_value(instruction->getOperand(6));
	comparison_id = impl.fixup_store_type_atomic(component_type, 1, comparison_id);
	new_value_id = impl.fixup_store_type_atomic(component_type, 1, new_value_id);

	op->add_id(counter_ptr_id);
	op->add_id(builder.makeUintConstant(spv::ScopeDevice));
	op->add_id(builder.makeUintConstant(0));
	op->add_id(builder.makeUintConstant(0));
	op->add_id(new_value_id);
	op->add_id(comparison_id);
	impl.add(op, meta.rov);
	impl.fixup_load_type_atomic(component_type, 1, instruction);
	return true;
}